

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperLib.c
# Opt level: O2

int Map_SuperLibDeriveFromGenlib2(Mio_Library_t *pLib,int fVerbose)

{
  int iVar1;
  Abc_Frame_t *pAbc;
  char *pcVar2;
  int iVar3;
  
  iVar3 = 0;
  pAbc = Abc_FrameGetGlobalFrame();
  if (pLib != (Mio_Library_t *)0x0) {
    pcVar2 = Mio_LibraryReadName(pLib);
    pcVar2 = Extra_FileNameGenericAppend(pcVar2,".super");
    iVar3 = 1;
    Super_Precompute(pLib,5,1,100000000,1e+07,1e+07,100,1,0,pcVar2);
    iVar1 = Cmd_CommandExecute(pAbc,pcVar2);
    if (iVar1 != 0) {
      iVar3 = 0;
      fprintf(_stdout,"Cannot execute command \"read_super %s\".\n",pcVar2);
    }
  }
  return iVar3;
}

Assistant:

int Map_SuperLibDeriveFromGenlib2( Mio_Library_t * pLib, int fVerbose )
{
    Abc_Frame_t * pAbc = Abc_FrameGetGlobalFrame();
    char * pFileName;
    if ( pLib == NULL )
        return 0;
    // compute supergates
    pFileName = Extra_FileNameGenericAppend(Mio_LibraryReadName(pLib), ".super");
    Super_Precompute( pLib, 5, 1, 100000000, 10000000, 10000000, 100, 1, 0, pFileName );
    // assuming that it terminated successfully
    if ( Cmd_CommandExecute( pAbc, pFileName ) )
    {
        fprintf( stdout, "Cannot execute command \"read_super %s\".\n", pFileName );
        return 0;
    }
    return 1;
}